

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extra_type_info.cpp
# Opt level: O2

bool __thiscall duckdb::ExtraTypeInfo::Equals(ExtraTypeInfo *this,ExtraTypeInfo *other_p)

{
  ExtraTypeInfoType EVar1;
  bool bVar2;
  int iVar3;
  
  EVar1 = this->type;
  if ((EVar1 < LIST_TYPE_INFO) && (EVar1 != DECIMAL_TYPE_INFO)) {
    if (other_p == (ExtraTypeInfo *)0x0) {
      if ((this->alias)._M_string_length == 0) {
        return (this->extension_info).
               super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
               .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl ==
               (ExtensionTypeInfo *)0x0;
      }
    }
    else {
      bVar2 = ::std::operator!=(&this->alias,&other_p->alias);
      if (!bVar2) {
        bVar2 = ExtensionTypeInfo::Equals
                          ((optional_ptr<duckdb::ExtensionTypeInfo,_true>)
                           (this->extension_info).
                           super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                           .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl,
                           (optional_ptr<duckdb::ExtensionTypeInfo,_true>)
                           (other_p->extension_info).
                           super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                           .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl);
        return bVar2;
      }
    }
  }
  else if ((other_p != (ExtraTypeInfo *)0x0) &&
          (((EVar1 == other_p->type &&
            (bVar2 = ::std::operator!=(&this->alias,&other_p->alias), !bVar2)) &&
           (bVar2 = ExtensionTypeInfo::Equals
                              ((optional_ptr<duckdb::ExtensionTypeInfo,_true>)
                               (this->extension_info).
                               super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                               ._M_t.
                               super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                               .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>.
                               _M_head_impl,
                               (optional_ptr<duckdb::ExtensionTypeInfo,_true>)
                               (other_p->extension_info).
                               super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                               ._M_t.
                               super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                               .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>.
                               _M_head_impl), bVar2)))) {
    iVar3 = (*this->_vptr_ExtraTypeInfo[4])(this,other_p);
    return SUB41(iVar3,0);
  }
  return false;
}

Assistant:

bool ExtraTypeInfo::Equals(ExtraTypeInfo *other_p) const {
	if (type == ExtraTypeInfoType::INVALID_TYPE_INFO || type == ExtraTypeInfoType::STRING_TYPE_INFO ||
	    type == ExtraTypeInfoType::GENERIC_TYPE_INFO) {
		if (!other_p) {
			if (!alias.empty()) {
				return false;
			}
			if (extension_info) {
				return false;
			}
			//! We only need to compare aliases when both types have them in this case
			return true;
		}
		if (alias != other_p->alias) {
			return false;
		}
		if (!ExtensionTypeInfo::Equals(extension_info, other_p->extension_info)) {
			return false;
		}
		return true;
	}
	if (!other_p) {
		return false;
	}
	if (type != other_p->type) {
		return false;
	}
	if (alias != other_p->alias) {
		return false;
	}
	if (!ExtensionTypeInfo::Equals(extension_info, other_p->extension_info)) {
		return false;
	}
	return EqualsInternal(other_p);
}